

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O0

uint32_t aout_addstr(char *s)

{
  int iVar1;
  unsigned_long uVar2;
  StrTabNode_conflict *pSVar3;
  size_t sVar4;
  char *in_RDI;
  StrTabNode_conflict *sn;
  StrTabNode_conflict **chain;
  StrTabNode_conflict **local_18;
  uint32_t local_4;
  
  local_18 = aoutstrlist.hashtab;
  uVar2 = elf_hash(in_RDI);
  local_18 = local_18 + (uVar2 & 0xffff);
  if (*in_RDI == '\0') {
    local_4 = 0;
  }
  else {
    while (pSVar3 = *local_18, pSVar3 != (StrTabNode_conflict *)0x0) {
      iVar1 = strcmp(in_RDI,pSVar3->str);
      if (iVar1 == 0) {
        return pSVar3->offset;
      }
      local_18 = &pSVar3->hashchain;
    }
    pSVar3 = (StrTabNode_conflict *)alloc(0);
    *local_18 = pSVar3;
    pSVar3->hashchain = (StrTabNode_conflict *)0x0;
    pSVar3->str = in_RDI;
    pSVar3->offset = aoutstrlist.nextoffset;
    addtail(&aoutstrlist.l,(node *)pSVar3);
    sVar4 = strlen(in_RDI);
    aoutstrlist.nextoffset = (int)sVar4 + 1 + aoutstrlist.nextoffset;
    local_4 = pSVar3->offset;
  }
  return local_4;
}

Assistant:

static uint32_t aout_addstr(const char *s)
/* add a new symbol name to the string table and return its offset */
{
  struct StrTabNode **chain = &aoutstrlist.hashtab[elf_hash(s)%STRHTABSIZE];
  struct StrTabNode *sn;

  if (*s == '\0')
    return (0);

  /* search string in hash table */
  while (sn = *chain) {
    if (!strcmp(s,sn->str))
      return (sn->offset);  /* it's already in, return offset */
    chain = &sn->hashchain;
  }

  /* new string table entry */
  *chain = sn = alloc(sizeof(struct StrTabNode));
  sn->hashchain = NULL;
  sn->str = s;
  sn->offset = aoutstrlist.nextoffset;
  addtail(&aoutstrlist.l,&sn->n);
  aoutstrlist.nextoffset += (uint32_t)strlen(s) + 1;
  return (sn->offset);
}